

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_expression.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::CastExpression::Copy(CastExpression *this)

{
  pointer pPVar1;
  pointer this_00;
  ParsedExpression *in_RSI;
  _Head_base<0UL,_duckdb::CastExpression_*,_false> local_30;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_28;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)(in_RSI + 1));
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_28,pPVar1);
  make_uniq<duckdb::CastExpression,duckdb::LogicalType_const&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,bool_const&>
            ((duckdb *)&local_30,(LogicalType *)&in_RSI[1].super_BaseExpression.type,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)&local_28,(bool *)in_RSI[1].super_BaseExpression.alias.field_2._M_local_buf);
  if (local_28._M_head_impl != (ParsedExpression *)0x0) {
    (*((local_28._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  this_00 = unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>::
            operator->((unique_ptr<duckdb::CastExpression,_std::default_delete<duckdb::CastExpression>,_true>
                        *)&local_30);
  ParsedExpression::CopyProperties(&this_00->super_ParsedExpression,in_RSI);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_30._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> CastExpression::Copy() const {
	auto copy = make_uniq<CastExpression>(cast_type, child->Copy(), try_cast);
	copy->CopyProperties(*this);
	return std::move(copy);
}